

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3_get_table_cb(void *pArg,int nCol,char **argv,char **colv)

{
  uint uVar1;
  int iVar2;
  void *pvVar3;
  char *pcVar4;
  int n;
  char **azNew;
  char *z;
  int i;
  int need;
  TabResult *p;
  char **colv_local;
  char **argv_local;
  int nCol_local;
  void *pArg_local;
  
  z._4_4_ = nCol;
  if ((*(int *)((long)pArg + 0x14) == 0) && (argv != (char **)0x0)) {
    z._4_4_ = nCol << 1;
  }
  if (*(uint *)((long)pArg + 0x10) < (uint)(*(int *)((long)pArg + 0x1c) + z._4_4_)) {
    *(int *)((long)pArg + 0x10) = *(int *)((long)pArg + 0x10) * 2 + z._4_4_;
    pvVar3 = sqlite3Realloc(*pArg,(ulong)*(uint *)((long)pArg + 0x10) << 3);
    if (pvVar3 == (void *)0x0) {
LAB_001c3160:
      *(undefined4 *)((long)pArg + 0x20) = 7;
      return 1;
    }
    *(void **)pArg = pvVar3;
  }
  if (*(int *)((long)pArg + 0x14) == 0) {
    *(int *)((long)pArg + 0x18) = nCol;
    for (z._0_4_ = 0; (int)z < nCol; z._0_4_ = (int)z + 1) {
      pcVar4 = sqlite3_mprintf("%s",colv[(int)z]);
      if (pcVar4 == (char *)0x0) goto LAB_001c3160;
      uVar1 = *(uint *)((long)pArg + 0x1c);
      *(uint *)((long)pArg + 0x1c) = uVar1 + 1;
      *(char **)(*pArg + (ulong)uVar1 * 8) = pcVar4;
    }
  }
  else if (*(int *)((long)pArg + 0x18) != nCol) {
    sqlite3_free(*(void **)((long)pArg + 8));
    pcVar4 = sqlite3_mprintf("sqlite3_get_table() called with two or more incompatible queries");
    *(char **)((long)pArg + 8) = pcVar4;
    *(undefined4 *)((long)pArg + 0x20) = 1;
    return 1;
  }
  if (argv != (char **)0x0) {
    for (z._0_4_ = 0; (int)z < nCol; z._0_4_ = (int)z + 1) {
      if (argv[(int)z] == (char *)0x0) {
        azNew = (char **)0x0;
      }
      else {
        iVar2 = sqlite3Strlen30(argv[(int)z]);
        azNew = (char **)sqlite3_malloc64((long)(iVar2 + 1));
        if (azNew == (char **)0x0) goto LAB_001c3160;
        memcpy(azNew,argv[(int)z],(long)(iVar2 + 1));
      }
      uVar1 = *(uint *)((long)pArg + 0x1c);
      *(uint *)((long)pArg + 0x1c) = uVar1 + 1;
      *(char ***)(*pArg + (ulong)uVar1 * 8) = azNew;
    }
    *(int *)((long)pArg + 0x14) = *(int *)((long)pArg + 0x14) + 1;
  }
  return 0;
}

Assistant:

static int sqlite3_get_table_cb(void *pArg, int nCol, char **argv, char **colv){
  TabResult *p = (TabResult*)pArg;  /* Result accumulator */
  int need;                         /* Slots needed in p->azResult[] */
  int i;                            /* Loop counter */
  char *z;                          /* A single column of result */

  /* Make sure there is enough space in p->azResult to hold everything
  ** we need to remember from this invocation of the callback.
  */
  if( p->nRow==0 && argv!=0 ){
    need = nCol*2;
  }else{
    need = nCol;
  }
  if( p->nData + need > p->nAlloc ){
    char **azNew;
    p->nAlloc = p->nAlloc*2 + need;
    azNew = sqlite3Realloc( p->azResult, sizeof(char*)*p->nAlloc );
    if( azNew==0 ) goto malloc_failed;
    p->azResult = azNew;
  }

  /* If this is the first row, then generate an extra row containing
  ** the names of all columns.
  */
  if( p->nRow==0 ){
    p->nColumn = nCol;
    for(i=0; i<nCol; i++){
      z = sqlite3_mprintf("%s", colv[i]);
      if( z==0 ) goto malloc_failed;
      p->azResult[p->nData++] = z;
    }
  }else if( (int)p->nColumn!=nCol ){
    sqlite3_free(p->zErrMsg);
    p->zErrMsg = sqlite3_mprintf(
       "sqlite3_get_table() called with two or more incompatible queries"
    );
    p->rc = SQLITE_ERROR;
    return 1;
  }

  /* Copy over the row data
  */
  if( argv!=0 ){
    for(i=0; i<nCol; i++){
      if( argv[i]==0 ){
        z = 0;
      }else{
        int n = sqlite3Strlen30(argv[i])+1;
        z = sqlite3_malloc64( n );
        if( z==0 ) goto malloc_failed;
        memcpy(z, argv[i], n);
      }
      p->azResult[p->nData++] = z;
    }
    p->nRow++;
  }
  return 0;

malloc_failed:
  p->rc = SQLITE_NOMEM_BKPT;
  return 1;
}